

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O1

void __thiscall Rml::FontEffectGlow::FontEffectGlow(FontEffectGlow *this)

{
  FontEffect::FontEffect(&this->super_FontEffect);
  (this->super_FontEffect)._vptr_FontEffect = (_func_int **)&PTR__FontEffectGlow_00336be8;
  (this->offset).x = 0;
  (this->offset).y = 0;
  ConvolutionFilter::ConvolutionFilter(&this->filter_outline);
  ConvolutionFilter::ConvolutionFilter(&this->filter_blur_x);
  ConvolutionFilter::ConvolutionFilter(&this->filter_blur_y);
  this->width_outline = 0;
  this->width_blur = 0;
  this->combined_width = 0;
  FontEffect::SetLayer(&this->super_FontEffect,Back);
  return;
}

Assistant:

FontEffectGlow::FontEffectGlow()
{
	width_blur = 0;
	width_outline = 0;
	combined_width = 0;
	SetLayer(Layer::Back);
}